

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesDedupOnOptimizedCases_Test::TestBody
          (DescriptorTest_FieldNamesDedupOnOptimizedCases_Test *this)

{
  ElementsAreMatcher<std::tuple<const_char_*,_const_char_*>_> matcher;
  bool bVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  _Head_base<0UL,_const_char_*,_false> matcher_00;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffee8;
  AssertHelper local_c8;
  Message local_c0;
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b8;
  testing local_a0 [8];
  char local_98 [8];
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  testing local_48 [8];
  _Tuple_impl<1UL,_const_char_*> _Stack_40;
  char local_38 [16];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  anon_class_1_0_00000001 collect_unique_names;
  DescriptorTest_FieldNamesDedupOnOptimizedCases_Test *this_local;
  
  testing::ElementsAre<char[11],char[12]>
            (local_48,(char (*) [11])"fieldName1",(char (*) [12])"field_name1");
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Head_base<0UL,_const_char_*,_false>._M_head_impl = in_stack_fffffffffffffee8._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_const_char_*,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       _Stack_40.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
            (matcher);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,0);
  TestBody::anon_class_1_0_00000001::operator()
            (&local_60,
             (anon_class_1_0_00000001 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(local_28,local_38,
               (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)"collect_unique_names(message4_->field(0))");
  absl::lts_20250127::
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~btree_set(&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  matcher_00._M_head_impl =
       (char *)_Stack_40.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3cf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
    matcher_00._M_head_impl =
         (char *)_Stack_40.super__Head_base<1UL,_const_char_*,_false>._M_head_impl;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  testing::ElementsAre<char[11]>(local_a0,(char (*) [11])"fieldname7");
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>
            ((ElementsAreMatcher<std::tuple<const_char_*>_>)matcher_00._M_head_impl);
  pFVar2 = Descriptor::field((this->super_DescriptorTest).message4_,6);
  TestBody::anon_class_1_0_00000001::operator()
            (&local_b8,
             (anon_class_1_0_00000001 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),pFVar2);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>::
  operator()(local_90,local_98,
             (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)"collect_unique_names(message4_->field(6))");
  absl::lts_20250127::
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~btree_set(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3d2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesDedupOnOptimizedCases) {
  const auto collect_unique_names = [](const FieldDescriptor* field) {
    absl::btree_set<absl::string_view> names{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
    // For names following the style guide, verify that we have the same number
    // of string objects as we have string values. That is, duplicate names use
    // the same std::string object. This is for memory efficiency.
    EXPECT_EQ(names.size(),
              (absl::flat_hash_set<const void*>{
                  field->name().data(), field->lowercase_name().data(),
                  field->camelcase_name().data(), field->json_name().data()}
                   .size()))
        << testing::PrintToString(names);
    return names;
  };

  // field_name1
  EXPECT_THAT(collect_unique_names(message4_->field(0)),
              ElementsAre("fieldName1", "field_name1"));
  // fieldname7
  EXPECT_THAT(collect_unique_names(message4_->field(6)),
              ElementsAre("fieldname7"));
}